

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

BitpackingMode duckdb::BitpackingModeFromString(string *str)

{
  int iVar1;
  BitpackingMode BVar2;
  string mode;
  string local_28;
  
  StringUtil::Lower(&local_28,str);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_28);
  BVar2 = AUTO;
  if (iVar1 != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_28);
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_28);
      if (iVar1 == 0) {
        BVar2 = CONSTANT;
      }
      else {
        iVar1 = ::std::__cxx11::string::compare((char *)&local_28);
        if (iVar1 == 0) {
          BVar2 = CONSTANT_DELTA;
        }
        else {
          iVar1 = ::std::__cxx11::string::compare((char *)&local_28);
          if (iVar1 == 0) {
            BVar2 = DELTA_FOR;
          }
          else {
            iVar1 = ::std::__cxx11::string::compare((char *)&local_28);
            BVar2 = (iVar1 == 0) * '\x05';
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return BVar2;
}

Assistant:

BitpackingMode BitpackingModeFromString(const string &str) {
	auto mode = StringUtil::Lower(str);
	if (mode == "auto" || mode == "none") {
		return BitpackingMode::AUTO;
	} else if (mode == "constant") {
		return BitpackingMode::CONSTANT;
	} else if (mode == "constant_delta") {
		return BitpackingMode::CONSTANT_DELTA;
	} else if (mode == "delta_for") {
		return BitpackingMode::DELTA_FOR;
	} else if (mode == "for") {
		return BitpackingMode::FOR;
	} else {
		return BitpackingMode::INVALID;
	}
}